

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O3

void idx2::InverseCdf53(v3i *M3,int Iter,array<idx2::subband> *Subbands,
                       transform_info *TransformDetails,volume *Vol,bool CoarsestLevel)

{
  double *pdVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  transform_info *ptVar5;
  char *__function;
  long lVar6;
  long lVar7;
  grid *pgVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [64];
  grid_iterator<signed_char> It;
  grid_iterator<signed_char> ItEnd;
  grid_iterator<double> local_c0;
  array<idx2::subband> *local_88;
  double local_80;
  int local_74;
  transform_info *local_70;
  grid_iterator<double> local_68;
  
  local_74 = Iter;
  if (0 < Subbands->Size) {
    local_70 = (transform_info *)&(TransformDetails->BasisNorms).WaveNorms;
    lVar7 = 0;
    auVar15 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    local_88 = Subbands;
    do {
      if (lVar7 != 0 || CoarsestLevel) {
        dVar14 = auVar15._0_8_;
        pgVar8 = (grid *)((Subbands->Buffer).Data + lVar7 * 0x40);
        dVar10 = dVar14;
        if ((M3->field_0).field_0.X != 1) {
          iVar4 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 3) +
                  TransformDetails->NPasses * local_74;
          if (*(char *)((long)&pgVar8[2].super_extent.From + 6) == '\0') {
            if (iVar4 < 0x11) {
              iVar4 = iVar4 + -1;
              ptVar5 = TransformDetails;
              goto LAB_0018de92;
            }
          }
          else {
            ptVar5 = local_70;
            if (iVar4 < 0x10) {
LAB_0018de92:
              dVar10 = (ptVar5->BasisNorms).ScalNorms.Arr[iVar4];
              goto LAB_0018de99;
            }
          }
          goto LAB_0018e90e;
        }
LAB_0018de99:
        dVar12 = dVar14;
        if ((M3->field_0).field_0.Y != 1) {
          iVar4 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 4) +
                  TransformDetails->NPasses * local_74;
          if (*(char *)((long)&pgVar8[2].super_extent.From + 7) == '\0') {
            if (iVar4 < 0x11) {
              iVar4 = iVar4 + -1;
              ptVar5 = TransformDetails;
              goto LAB_0018dedb;
            }
          }
          else {
            ptVar5 = local_70;
            if (iVar4 < 0x10) {
LAB_0018dedb:
              dVar12 = (ptVar5->BasisNorms).ScalNorms.Arr[iVar4];
              goto LAB_0018dee2;
            }
          }
          goto LAB_0018e90e;
        }
LAB_0018dee2:
        dVar13 = dVar14;
        if ((M3->field_0).field_0.Z != 1) {
          iVar4 = (int)*(char *)((long)&pgVar8[2].super_extent.From + 5) +
                  TransformDetails->NPasses * local_74;
          if ((char)pgVar8[2].super_extent.Dims == '\0') {
            if (iVar4 < 0x11) {
              iVar4 = iVar4 + -1;
              ptVar5 = TransformDetails;
              goto LAB_0018df24;
            }
          }
          else {
            ptVar5 = local_70;
            if (iVar4 < 0x10) {
LAB_0018df24:
              dVar13 = (ptVar5->BasisNorms).ScalNorms.Arr[iVar4];
              goto LAB_0018df2b;
            }
          }
LAB_0018e90e:
          __function = 
          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
          goto LAB_0018e923;
        }
LAB_0018df2b:
        if (Vol->Type < __Invalid__) {
          local_80 = dVar14 / (dVar10 * dVar12 * dVar13);
          switch(Vol->Type) {
          case int8:
            End<signed_char>((grid_iterator<signed_char> *)&local_68,pgVar8,Vol);
            Begin<signed_char>((grid_iterator<signed_char> *)&local_c0,pgVar8,Vol);
            while (local_c0.Ptr != local_68.Ptr) {
              *(char *)local_c0.Ptr = (char)(int)(local_80 * (double)(int)*(char *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.S.field_0.field_0.X + (long)local_c0.Ptr);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar6 -
                               (long)local_c0.D.field_0.field_0.X));
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar6 -
                                 local_c0.D.field_0.field_0.Y * lVar6));
                }
              }
            }
            break;
          case uint8:
            End<unsigned_char>((grid_iterator<unsigned_char> *)&local_68,pgVar8,Vol);
            Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_c0,pgVar8,Vol);
            while (local_c0.Ptr != local_68.Ptr) {
              *(char *)local_c0.Ptr = (char)(int)(local_80 * (double)*(byte *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.S.field_0.field_0.X + (long)local_c0.Ptr);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar6 -
                               (long)local_c0.D.field_0.field_0.X));
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar6 -
                                 local_c0.D.field_0.field_0.Y * lVar6));
                }
              }
            }
            break;
          case int16:
            End<short>((grid_iterator<short> *)&local_68,pgVar8,Vol);
            Begin<short>((grid_iterator<short> *)&local_c0,pgVar8,Vol);
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(short *)pdVar1 = (short)(int)(local_80 * (double)(int)*(short *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 2);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar6 * 2 +
                         (long)local_c0.D.field_0.field_0.X * -2);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar6
                           * 2 + local_c0.D.field_0.field_0.Y * lVar6 * -2);
                }
              }
            }
            break;
          case uint16:
            End<unsigned_short>((grid_iterator<unsigned_short> *)&local_68,pgVar8,Vol);
            Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_c0,pgVar8,Vol);
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(short *)pdVar1 = (short)(int)(local_80 * (double)*(ushort *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 2);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar6 * 2 +
                         (long)local_c0.D.field_0.field_0.X * -2);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar6
                           * 2 + local_c0.D.field_0.field_0.Y * lVar6 * -2);
                }
              }
            }
            break;
          case int32:
            End<int>((grid_iterator<int> *)&local_68,pgVar8,Vol);
            Begin<int>((grid_iterator<int> *)&local_c0,pgVar8,Vol);
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(int *)pdVar1 = (int)(local_80 * (double)(int)*(float *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 4);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar6 * 4 +
                         (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar6
                           * 4 + local_c0.D.field_0.field_0.Y * lVar6 * -4);
                }
              }
            }
            break;
          case uint32:
            End<unsigned_int>((grid_iterator<unsigned_int> *)&local_68,pgVar8,Vol);
            Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_c0,pgVar8,Vol);
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(float *)pdVar1 = (float)(long)(local_80 * (double)(uint)*(float *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 4);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar6 * 4 +
                         (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar6
                           * 4 + local_c0.D.field_0.field_0.Y * lVar6 * -4);
                }
              }
            }
            break;
          case int64:
            End<long>((grid_iterator<long> *)&local_68,pgVar8,Vol);
            Begin<long>((grid_iterator<long> *)&local_c0,pgVar8,Vol);
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *pdVar1 = (double)(long)(local_80 * (double)(long)*pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = pdVar1 + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = pdVar1 + (local_c0.S.field_0.field_0.Y * lVar6 -
                                  (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = pdVar1 + ((long)local_c0.N.field_0.field_0.Y *
                                     local_c0.S.field_0.field_0.Z * lVar6 -
                                    local_c0.D.field_0.field_0.Y * lVar6);
                }
              }
            }
            break;
          case uint64:
            End<unsigned_long>((grid_iterator<unsigned_long> *)&local_68,pgVar8,Vol);
            Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_c0,pgVar8,Vol);
            auVar3 = _DAT_001a8f70;
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *pdVar1;
              auVar11 = vunpcklps_avx(auVar11,ZEXT816(0x4530000043300000));
              auVar11 = vsubpd_avx(auVar11,auVar3);
              dVar10 = local_80 * (auVar11._0_8_ + auVar11._8_8_);
              uVar9 = (ulong)dVar10;
              *pdVar1 = (double)((long)(dVar10 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f |
                                uVar9);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = pdVar1 + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = pdVar1 + (local_c0.S.field_0.field_0.Y * lVar6 -
                                  (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = pdVar1 + ((long)local_c0.N.field_0.field_0.Y *
                                     local_c0.S.field_0.field_0.Z * lVar6 -
                                    local_c0.D.field_0.field_0.Y * lVar6);
                }
              }
            }
            break;
          case float32:
            End<float>((grid_iterator<float> *)&local_68,pgVar8,Vol);
            Begin<float>((grid_iterator<float> *)&local_c0,pgVar8,Vol);
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *(float *)pdVar1 = (float)(local_80 * (double)*(float *)pdVar1);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = (double *)((long)pdVar1 + (long)local_c0.S.field_0.field_0.X * 4);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = (double *)
                         ((long)pdVar1 +
                         local_c0.S.field_0.field_0.Y * lVar6 * 4 +
                         (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = (double *)
                           ((long)pdVar1 +
                           (long)local_c0.N.field_0.field_0.Y * local_c0.S.field_0.field_0.Z * lVar6
                           * 4 + local_c0.D.field_0.field_0.Y * lVar6 * -4);
                }
              }
            }
            break;
          case float64:
            End<double>(&local_68,pgVar8,Vol);
            Begin<double>(&local_c0,pgVar8,Vol);
            pdVar1 = local_c0.Ptr;
            while (pdVar1 != local_68.Ptr) {
              *pdVar1 = local_80 * *pdVar1;
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              pdVar1 = pdVar1 + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar6 = (long)local_c0.N.field_0.field_0.X;
                pdVar1 = pdVar1 + (local_c0.S.field_0.field_0.Y * lVar6 -
                                  (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  pdVar1 = pdVar1 + ((long)local_c0.N.field_0.field_0.Y *
                                     local_c0.S.field_0.field_0.Z * lVar6 -
                                    local_c0.D.field_0.field_0.Y * lVar6);
                }
              }
            }
          }
          auVar15 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          Subbands = local_88;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < Subbands->Size);
  }
  uVar9 = (ulong)TransformDetails->StackSize;
  if (0 < (long)uVar9) {
    pgVar8 = (TransformDetails->StackGrids).Arr + (uVar9 - 1);
    do {
      if (0x20 < uVar9) {
        __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
LAB_0018e923:
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,__function);
      }
      if (Vol->Type < __Invalid__) {
        iVar4 = (TransformDetails->StackAxes).Arr[uVar9 - 1];
        if (iVar4 == 2) {
          ILiftCdf53Z<double>(pgVar8,M3,Normal,Vol);
        }
        else if (iVar4 == 1) {
          ILiftCdf53Y<double>(pgVar8,M3,Normal,Vol);
        }
        else if (iVar4 == 0) {
          ILiftCdf53X<double>(pgVar8,M3,Normal,Vol);
        }
      }
      pgVar8 = pgVar8 + -1;
      bVar2 = 1 < uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void
InverseCdf53(const v3i& M3,
             int Iter,
             const array<subband>& Subbands,
             const transform_info& TransformDetails,
             volume* Vol,
             bool CoarsestLevel)
{
  /* inverse normalize if required */
  idx2_Assert(IsFloatingPoint(Vol->Type));
  for (int I = 0; I < Size(Subbands); ++I)
  {
    if (I == 0 && !CoarsestLevel)
      continue; // do not normalize subband 0
    subband& S = Subbands[I];
    f64 Wx = M3.X == 1
               ? 1
               : (S.LowHigh3.X == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X]);
    f64 Wy = M3.Y == 1
               ? 1
               : (S.LowHigh3.Y == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y]);
    f64 Idx2 = M3.Z == 1 ? 1
                         : (S.LowHigh3.Z == 0
                              ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z - 1]
                              : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z]);
    f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }

  /* perform the inverse transform */
  int I = TransformDetails.StackSize;
  while (I-- > 0)
  {
    int D = TransformDetails.StackAxes[I];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}